

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O2

void output_and_account_example(vw *all,example *ec)

{
  float fVar1;
  int *piVar2;
  size_t i;
  ulong uVar3;
  
  fVar1 = (ec->l).simple.label;
  shared_data::update(all->sd,ec->test_only,(bool)(-(fVar1 != 3.4028235e+38) & 1),ec->loss,
                      ec->weight,ec->num_features);
  if (((fVar1 != 3.4028235e+38) || (NAN(fVar1))) && (ec->test_only == false)) {
    all->sd->weighted_labels = (double)ec->weight * (double)fVar1 + all->sd->weighted_labels;
  }
  (*all->print)(all->raw_prediction,ec->partial_prediction,-1.0,ec->tag);
  for (uVar3 = 0; piVar2 = (all->final_prediction_sink)._begin,
      uVar3 < (ulong)((long)(all->final_prediction_sink)._end - (long)piVar2 >> 2);
      uVar3 = uVar3 + 1) {
    (*all->print)(piVar2[uVar3],(ec->pred).scalar,0.0,ec->tag);
  }
  print_update(all,ec);
  return;
}

Assistant:

void output_and_account_example(vw& all, example& ec)
{
  label_data ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    all.print(f, ec.pred.scalar, 0, ec.tag);
  }

  print_update(all, ec);
}